

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ev_dfg.c
# Opt level: O2

void fdump_dfg_config_action(FILE *out,EVdfg_config_action act)

{
  undefined8 uVar1;
  ulong uVar2;
  char *pcVar3;
  
  uVar1 = act.u._0_8_;
  switch(act.type) {
  case ACT_no_op:
    fwrite("Action is NO_OP\n",0x10,1,(FILE *)out);
    return;
  case ACT_create:
    pcVar3 = "Action is CREATE_STONE, stone_id = %x, action %s\n";
    goto LAB_001468f2;
  case ACT_add_action:
    pcVar3 = "Action is ADD_ACTION, stone_id = %x, action %s\n";
LAB_001468f2:
    fprintf((FILE *)out,pcVar3,(ulong)(uint)act.stone_id,uVar1);
    return;
  case ACT_set_auto_period:
    pcVar3 = "Action is SET_AUTO_PERIOD, stone_id = %x, secs %d, usecs %d\n";
    goto LAB_001468c1;
  case ACT_link_port:
    pcVar3 = "Action is LINK_PORT, src_stone_id = %x, port %d, dest_stone_id %x\n";
LAB_001468c1:
    fprintf((FILE *)out,pcVar3,(ulong)(uint)act.stone_id,(ulong)(uint)act.u.period.secs,
            (ulong)(uint)act.u.period.usecs);
    return;
  case ACT_link_dest:
    uVar2 = (ulong)(uint)act.u.period.usecs;
    pcVar3 = "Action is LINK_DEST, src_stone_id = %x, dest_stone_id %x\n";
    break;
  case ACT_unlink_port:
    uVar2 = (ulong)(uint)act.u.period.secs;
    pcVar3 = "Action is UNLINK_PORT, src_stone_id = %x, port %d\n";
    break;
  case ACT_unlink_dest:
    uVar2 = (ulong)(uint)act.u.period.usecs;
    pcVar3 = "Action is UNLINK_DEST, src_stone_id = %x, dest %x\n";
    break;
  case ACT_set_attrs:
    fprintf((FILE *)out,"Action is SET_ATTRS, stone_id = %x, attrs ",(ulong)(uint)act.stone_id);
    fdump_attr_list(out,uVar1);
    return;
  case ACT_destroy:
    pcVar3 = "Action is DESTROY, stone_id = %x\n";
    goto LAB_00146963;
  case ACT_freeze:
    pcVar3 = "Action is FREEZE, stone_id = %x\n";
    goto LAB_00146963;
  case ACT_unfreeze:
    pcVar3 = "Action is UNFREEZE, stone_id = %x\n";
LAB_00146963:
    fprintf((FILE *)out,pcVar3,(ulong)(uint)act.stone_id);
    return;
  case ACT_assign_node:
    uVar2 = (ulong)(uint)act.u.period.secs;
    pcVar3 = "Action is ASSIGN_NODE, stone_id = %x, node = %d\n";
    break;
  case ACT_create_bridge:
    fprintf((FILE *)out,"Action is CREATE_BRIDGE, stone_id = %x, target %x, action %s\n",
            (ulong)(uint)act.stone_id,(ulong)(uint)act.u.bridge.target_id,uVar1);
    return;
  default:
    return;
  }
  fprintf((FILE *)out,pcVar3,(ulong)(uint)act.stone_id,uVar2);
  return;
}

Assistant:

static void
fdump_dfg_config_action(FILE *out, EVdfg_config_action act)
{
    switch(act.type) {
    case ACT_no_op:
	fprintf(out, "Action is NO_OP\n");
	break;
    case ACT_create_bridge:
	fprintf(out, "Action is CREATE_BRIDGE, stone_id = %x, target %x, action %s\n",
		act.stone_id, act.u.bridge.target_id, act.u.bridge.action);
	break;
    case ACT_create:
	fprintf(out, "Action is CREATE_STONE, stone_id = %x, action %s\n",
		act.stone_id, act.u.create.action);
	break;
    case ACT_add_action:
	fprintf(out, "Action is ADD_ACTION, stone_id = %x, action %s\n",
		act.stone_id, act.u.create.action);
	break;
    case ACT_set_auto_period:
	fprintf(out, "Action is SET_AUTO_PERIOD, stone_id = %x, secs %d, usecs %d\n",
		act.stone_id, act.u.period.secs, act.u.period.usecs);
	break;
    case ACT_link_port:
	fprintf(out, "Action is LINK_PORT, src_stone_id = %x, port %d, dest_stone_id %x\n",
		act.stone_id, act.u.link.port, act.u.link.dest_id);
	break;
    case ACT_link_dest:
	fprintf(out, "Action is LINK_DEST, src_stone_id = %x, dest_stone_id %x\n",
		act.stone_id, act.u.link.dest_id);
	break;
    case ACT_unlink_port:
	fprintf(out, "Action is UNLINK_PORT, src_stone_id = %x, port %d\n",
		act.stone_id, act.u.link.port);
	break;
    case ACT_unlink_dest:
	fprintf(out, "Action is UNLINK_DEST, src_stone_id = %x, dest %x\n",
		act.stone_id, act.u.link.dest_id);
	break;
    case ACT_set_attrs: 
	fprintf(out, "Action is SET_ATTRS, stone_id = %x, attrs ",
		act.stone_id);
	fdump_attr_list(out, act.u.attrs.attrs);
	break;
    case ACT_assign_node:
	fprintf(out, "Action is ASSIGN_NODE, stone_id = %x, node = %d\n",
		act.stone_id, act.u.assign.dest_node);
	break;
    case ACT_destroy:
	fprintf(out, "Action is DESTROY, stone_id = %x\n",
		act.stone_id);
	break;
    case ACT_freeze:
	fprintf(out, "Action is FREEZE, stone_id = %x\n",
		act.stone_id);
	break;
    case ACT_unfreeze:
	fprintf(out, "Action is UNFREEZE, stone_id = %x\n",
		act.stone_id);
	break;
    }
}